

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iLimit,size_t *offsetPtr)

{
  ZSTD_compressionParameters *cParams;
  uint uVar1;
  int iVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  ZSTD_matchState_t *pZVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  bool bVar8;
  uint uVar9;
  size_t sVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong *puVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  ulong local_98;
  
  uVar1 = (ms->cParams).minMatch;
  cParams = &ms->cParams;
  iVar21 = (int)ip;
  if (uVar1 - 6 < 2) {
    pUVar3 = ms->chainTable;
    uVar19 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
    pBVar4 = (ms->window).base;
    uVar1 = (ms->window).dictLimit;
    uVar12 = (ms->window).lowLimit;
    uVar14 = iVar21 - (int)pBVar4;
    uVar11 = uVar14 - uVar19;
    if (uVar14 < uVar19) {
      uVar11 = 0;
    }
    iVar21 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    uVar9 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,ip,6);
    local_98 = 3;
    if (uVar12 < uVar9) {
      local_98 = 3;
      do {
        puVar16 = (ulong *)(pBVar4 + uVar9);
        if (*(BYTE *)(local_98 + (long)puVar16) == ip[local_98]) {
          puVar17 = (ulong *)ip;
          if (ip < iLimit + -7) {
            uVar18 = *(ulong *)ip ^ *puVar16;
            uVar15 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar15 = uVar15 >> 3 & 0x1fffffff;
            puVar17 = (ulong *)(ip + 8);
            if (*puVar16 == *(ulong *)ip) {
              do {
                puVar16 = puVar16 + 1;
                if (iLimit + -7 <= puVar17) goto LAB_00494e48;
                uVar18 = *puVar17;
                uVar13 = uVar18 ^ *puVar16;
                uVar15 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                uVar15 = (long)puVar17 + ((uVar15 >> 3 & 0x1fffffff) - (long)ip);
                puVar17 = puVar17 + 1;
              } while (*puVar16 == uVar18);
            }
          }
          else {
LAB_00494e48:
            if ((puVar17 < iLimit + -3) && ((int)*puVar16 == (int)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 4);
              puVar16 = (ulong *)((long)puVar16 + 4);
            }
            if ((puVar17 < iLimit + -1) && ((short)*puVar16 == (short)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 2);
              puVar16 = (ulong *)((long)puVar16 + 2);
            }
            if (puVar17 < iLimit) {
              puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar16 == (char)*puVar17));
            }
            uVar15 = (long)puVar17 - (long)ip;
          }
        }
        else {
          uVar15 = 0;
        }
        if ((local_98 < uVar15) &&
           (*offsetPtr = (ulong)((uVar14 + 2) - uVar9), local_98 = uVar15, ip + uVar15 == iLimit)) {
          bVar8 = false;
        }
        else if (uVar11 < uVar9) {
          uVar9 = pUVar3[uVar9 & uVar19 - 1];
          bVar8 = true;
        }
        else {
          bVar8 = false;
        }
      } while (((bVar8) && (iVar21 = iVar21 + -1, uVar12 < uVar9)) && (iVar21 != 0));
    }
    pZVar5 = ms->dictMatchState;
    uVar11 = 1 << ((byte)(pZVar5->cParams).chainLog & 0x1f);
    pBVar6 = (pZVar5->window).nextSrc;
    pBVar7 = (pZVar5->window).base;
    uVar12 = (int)pBVar6 - (int)pBVar7;
    uVar19 = uVar12 - uVar11;
    if (uVar12 < uVar11) {
      uVar19 = 0;
    }
    uVar9 = (pZVar5->window).dictLimit;
    uVar20 = pZVar5->hashTable
             [(ulong)(*(long *)ip * -0x30e4432340650000) >>
              (-(char)(pZVar5->cParams).hashLog & 0x3fU)];
    if (iVar21 != 0 && uVar9 < uVar20) {
      pUVar3 = pZVar5->chainTable;
      iVar2 = *(int *)ip;
      do {
        iVar21 = iVar21 + -1;
        if (*(int *)(pBVar7 + uVar20) == iVar2) {
          sVar10 = ZSTD_count_2segments
                             (ip + 4,pBVar7 + (ulong)uVar20 + 4,iLimit,pBVar6,pBVar4 + uVar1);
          uVar15 = sVar10 + 4;
        }
        else {
          uVar15 = 0;
        }
        if ((local_98 < uVar15) &&
           (*offsetPtr = (ulong)(((uVar14 - uVar1) + uVar12 + 2) - uVar20), local_98 = uVar15,
           ip + uVar15 == iLimit)) {
          bVar8 = false;
        }
        else if (uVar19 < uVar20) {
          uVar20 = pUVar3[uVar20 & uVar11 - 1];
          bVar8 = true;
        }
        else {
          bVar8 = false;
        }
      } while (((bVar8) && (uVar9 < uVar20)) && (iVar21 != 0));
    }
  }
  else if (uVar1 == 5) {
    pUVar3 = ms->chainTable;
    uVar14 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
    pBVar4 = (ms->window).base;
    uVar1 = (ms->window).dictLimit;
    uVar12 = (ms->window).lowLimit;
    uVar19 = iVar21 - (int)pBVar4;
    uVar11 = uVar19 - uVar14;
    if (uVar19 < uVar14) {
      uVar11 = 0;
    }
    iVar21 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    uVar9 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,ip,5);
    local_98 = 3;
    if (uVar12 < uVar9) {
      local_98 = 3;
      do {
        puVar16 = (ulong *)(pBVar4 + uVar9);
        if (*(BYTE *)(local_98 + (long)puVar16) == ip[local_98]) {
          puVar17 = (ulong *)ip;
          if (ip < iLimit + -7) {
            uVar18 = *(ulong *)ip ^ *puVar16;
            uVar15 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar15 = uVar15 >> 3 & 0x1fffffff;
            puVar17 = (ulong *)(ip + 8);
            if (*puVar16 == *(ulong *)ip) {
              do {
                puVar16 = puVar16 + 1;
                if (iLimit + -7 <= puVar17) goto LAB_00495054;
                uVar18 = *puVar17;
                uVar13 = uVar18 ^ *puVar16;
                uVar15 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                uVar15 = (long)puVar17 + ((uVar15 >> 3 & 0x1fffffff) - (long)ip);
                puVar17 = puVar17 + 1;
              } while (*puVar16 == uVar18);
            }
          }
          else {
LAB_00495054:
            if ((puVar17 < iLimit + -3) && ((int)*puVar16 == (int)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 4);
              puVar16 = (ulong *)((long)puVar16 + 4);
            }
            if ((puVar17 < iLimit + -1) && ((short)*puVar16 == (short)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 2);
              puVar16 = (ulong *)((long)puVar16 + 2);
            }
            if (puVar17 < iLimit) {
              puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar16 == (char)*puVar17));
            }
            uVar15 = (long)puVar17 - (long)ip;
          }
        }
        else {
          uVar15 = 0;
        }
        if ((local_98 < uVar15) &&
           (*offsetPtr = (ulong)((uVar19 + 2) - uVar9), local_98 = uVar15, ip + uVar15 == iLimit)) {
          bVar8 = false;
        }
        else if (uVar11 < uVar9) {
          uVar9 = pUVar3[uVar9 & uVar14 - 1];
          bVar8 = true;
        }
        else {
          bVar8 = false;
        }
      } while (((bVar8) && (iVar21 = iVar21 + -1, uVar12 < uVar9)) && (iVar21 != 0));
    }
    pZVar5 = ms->dictMatchState;
    uVar9 = 1 << ((byte)(pZVar5->cParams).chainLog & 0x1f);
    uVar12 = (pZVar5->window).dictLimit;
    pBVar6 = (pZVar5->window).nextSrc;
    pBVar7 = (pZVar5->window).base;
    uVar11 = (int)pBVar6 - (int)pBVar7;
    uVar14 = uVar11 - uVar9;
    if (uVar11 < uVar9) {
      uVar14 = 0;
    }
    uVar20 = pZVar5->hashTable
             [(ulong)(*(long *)ip * -0x30e4432345000000) >>
              (-(char)(pZVar5->cParams).hashLog & 0x3fU)];
    if (iVar21 != 0 && uVar12 < uVar20) {
      pUVar3 = pZVar5->chainTable;
      iVar2 = *(int *)ip;
      do {
        iVar21 = iVar21 + -1;
        if (*(int *)(pBVar7 + uVar20) == iVar2) {
          sVar10 = ZSTD_count_2segments
                             (ip + 4,pBVar7 + (ulong)uVar20 + 4,iLimit,pBVar6,pBVar4 + uVar1);
          uVar15 = sVar10 + 4;
        }
        else {
          uVar15 = 0;
        }
        if ((local_98 < uVar15) &&
           (*offsetPtr = (ulong)(((uVar19 - uVar1) + uVar11 + 2) - uVar20), local_98 = uVar15,
           ip + uVar15 == iLimit)) {
          bVar8 = false;
        }
        else if (uVar14 < uVar20) {
          uVar20 = pUVar3[uVar20 & uVar9 - 1];
          bVar8 = true;
        }
        else {
          bVar8 = false;
        }
      } while (((bVar8) && (uVar12 < uVar20)) && (iVar21 != 0));
    }
  }
  else {
    pUVar3 = ms->chainTable;
    uVar14 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
    pBVar4 = (ms->window).base;
    uVar1 = (ms->window).dictLimit;
    uVar12 = (ms->window).lowLimit;
    uVar19 = iVar21 - (int)pBVar4;
    uVar11 = uVar19 - uVar14;
    if (uVar19 < uVar14) {
      uVar11 = 0;
    }
    iVar21 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    uVar9 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,ip,4);
    local_98 = 3;
    if (uVar12 < uVar9) {
      local_98 = 3;
      do {
        puVar16 = (ulong *)(pBVar4 + uVar9);
        if (*(BYTE *)(local_98 + (long)puVar16) == ip[local_98]) {
          puVar17 = (ulong *)ip;
          if (ip < iLimit + -7) {
            uVar18 = *(ulong *)ip ^ *puVar16;
            uVar15 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar15 = uVar15 >> 3 & 0x1fffffff;
            puVar17 = (ulong *)(ip + 8);
            if (*puVar16 == *(ulong *)ip) {
              do {
                puVar16 = puVar16 + 1;
                if (iLimit + -7 <= puVar17) goto LAB_004953b0;
                uVar18 = *puVar17;
                uVar13 = uVar18 ^ *puVar16;
                uVar15 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                uVar15 = (long)puVar17 + ((uVar15 >> 3 & 0x1fffffff) - (long)ip);
                puVar17 = puVar17 + 1;
              } while (*puVar16 == uVar18);
            }
          }
          else {
LAB_004953b0:
            if ((puVar17 < iLimit + -3) && ((int)*puVar16 == (int)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 4);
              puVar16 = (ulong *)((long)puVar16 + 4);
            }
            if ((puVar17 < iLimit + -1) && ((short)*puVar16 == (short)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 2);
              puVar16 = (ulong *)((long)puVar16 + 2);
            }
            if (puVar17 < iLimit) {
              puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar16 == (char)*puVar17));
            }
            uVar15 = (long)puVar17 - (long)ip;
          }
        }
        else {
          uVar15 = 0;
        }
        if ((local_98 < uVar15) &&
           (*offsetPtr = (ulong)((uVar19 + 2) - uVar9), local_98 = uVar15, ip + uVar15 == iLimit)) {
          bVar8 = false;
        }
        else if (uVar11 < uVar9) {
          uVar9 = pUVar3[uVar9 & uVar14 - 1];
          bVar8 = true;
        }
        else {
          bVar8 = false;
        }
      } while (((bVar8) && (iVar21 = iVar21 + -1, uVar12 < uVar9)) && (iVar21 != 0));
    }
    pZVar5 = ms->dictMatchState;
    uVar9 = 1 << ((byte)(pZVar5->cParams).chainLog & 0x1f);
    uVar12 = (pZVar5->window).dictLimit;
    pBVar6 = (pZVar5->window).nextSrc;
    pBVar7 = (pZVar5->window).base;
    uVar11 = (int)pBVar6 - (int)pBVar7;
    uVar14 = uVar11 - uVar9;
    if (uVar11 < uVar9) {
      uVar14 = 0;
    }
    iVar2 = *(int *)ip;
    uVar20 = pZVar5->hashTable
             [(uint)(iVar2 * -0x61c8864f) >> (-(char)(pZVar5->cParams).hashLog & 0x1fU)];
    if (iVar21 != 0 && uVar12 < uVar20) {
      pUVar3 = pZVar5->chainTable;
      do {
        iVar21 = iVar21 + -1;
        if (*(int *)(pBVar7 + uVar20) == iVar2) {
          sVar10 = ZSTD_count_2segments
                             (ip + 4,pBVar7 + (ulong)uVar20 + 4,iLimit,pBVar6,pBVar4 + uVar1);
          uVar15 = sVar10 + 4;
        }
        else {
          uVar15 = 0;
        }
        if ((local_98 < uVar15) &&
           (*offsetPtr = (ulong)(((uVar19 - uVar1) + uVar11 + 2) - uVar20), local_98 = uVar15,
           ip + uVar15 == iLimit)) {
          bVar8 = false;
        }
        else if (uVar14 < uVar20) {
          uVar20 = pUVar3[uVar20 & uVar9 - 1];
          bVar8 = true;
        }
        else {
          bVar8 = false;
        }
      } while (((bVar8) && (uVar12 < uVar20)) && (iVar21 != 0));
    }
  }
  return local_98;
}

Assistant:

static size_t ZSTD_HcFindBestMatch_dictMatchState_selectMLS (
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* const iLimit,
                        size_t* offsetPtr)
{
    switch(ms->cParams.minMatch)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 4, ZSTD_dictMatchState);
    case 5 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 5, ZSTD_dictMatchState);
    case 7 :
    case 6 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 6, ZSTD_dictMatchState);
    }
}